

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O2

bool isBasisConsistent(HighsLp *lp,HighsBasis *basis)

{
  uint uVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  bVar2 = isBasisRightSize(lp,basis);
  uVar3 = 0;
  if (bVar2) {
    uVar5 = (ulong)(uint)lp->num_col_;
    if (lp->num_col_ < 1) {
      uVar5 = uVar3;
    }
    for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      uVar3 = (ulong)((int)uVar3 +
                     (uint)((basis->col_status).
                            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar4] == kBasic));
    }
    uVar1 = lp->num_row_;
    uVar5 = 0;
    uVar4 = 0;
    if (0 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      uVar3 = (ulong)((uint)uVar3 +
                     (uint)((basis->row_status).
                            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar5] == kBasic));
    }
    uVar3 = (ulong)((uint)uVar3 == uVar1);
  }
  return SUB81(uVar3,0);
}

Assistant:

bool isBasisConsistent(const HighsLp& lp, const HighsBasis& basis) {
  if (!isBasisRightSize(lp, basis)) return false;

  HighsInt num_basic_variables = 0;
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    if (basis.col_status[iCol] == HighsBasisStatus::kBasic)
      num_basic_variables++;
  }
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    if (basis.row_status[iRow] == HighsBasisStatus::kBasic)
      num_basic_variables++;
  }
  return num_basic_variables == lp.num_row_;
}